

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool SingleTreeSearchHelperBool
               (ON_RTreeBranch *a_branchA,ON_RTreeNode *a_nodeB,
               ON_RTreePairSearchCallbackResultBool *a_result)

{
  ON_RTreeBranch *a_rectB;
  int iVar1;
  bool bVar2;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar3;
  ON_RTreeNode *pOVar4;
  bool bVar5;
  
  iVar1 = a_nodeB->m_count;
  pOVar4 = a_nodeB;
  if (a_nodeB->m_level < 1) {
    do {
      paVar3 = &pOVar4->m_branch[0].field_1;
      a_rectB = pOVar4->m_branch;
      bVar5 = a_nodeB->m_branch + iVar1 <= a_rectB;
      if (bVar5) {
        return bVar5;
      }
      pOVar4 = (ON_RTreeNode *)paVar3;
    } while (((a_rectB <= a_branchA) ||
             (bVar2 = PairSearchOverlapHelper
                                (&a_branchA->m_rect,&a_rectB->m_rect,a_result->m_tolerance), !bVar2)
             ) || (bVar2 = (*a_result->m_resultCallbackBool)
                                     (a_result->m_context,(ON__INT_PTR)(a_branchA->field_1).m_child,
                                      (ON__INT_PTR)paVar3->m_child), bVar2));
  }
  else {
    do {
      paVar3 = &pOVar4->m_branch[0].field_1;
      bVar5 = a_nodeB->m_branch + iVar1 <= pOVar4->m_branch;
      if (bVar5) {
        return bVar5;
      }
      bVar2 = PairSearchOverlapHelper
                        (&a_branchA->m_rect,&pOVar4->m_branch[0].m_rect,a_result->m_tolerance);
      pOVar4 = (ON_RTreeNode *)paVar3;
    } while ((!bVar2) ||
            (bVar2 = SingleTreeSearchHelperBool(a_branchA,paVar3->m_child,a_result), bVar2));
  }
  return bVar5;
}

Assistant:

static bool SingleTreeSearchHelperBool(const ON_RTreeBranch* a_branchA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchCallbackResultBool* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchB, *branchBmax;

  branchB = a_nodeB->m_branch;
  branchBmax = branchB + a_nodeB->m_count;

  if (a_nodeB->m_level > 0)
  {
    // branchB's have children nodes and a_branchA is a leaf
    while (branchB < branchBmax)
    {
      if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
      {
        if (!SingleTreeSearchHelperBool(a_branchA, branchB->m_child, a_result))
          return false;
      }
      branchB++;
    }
  }
  else
  {
    // branchB's are all leaves
    while (branchB < branchBmax)
    {
      if (a_branchA < branchB)
      {
        if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
        {
          if (!a_result->m_resultCallbackBool(a_result->m_context, a_branchA->m_id, branchB->m_id))
            return false;
        }
      }
      branchB++;
    }
  }

  return true;
}